

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::layoutChanged(QAbstractItemModelTesterPrivate *this)

{
  bool bVar1;
  undefined4 uVar2;
  qsizetype qVar3;
  reference pQVar4;
  QAbstractItemModel *pQVar5;
  long in_RDI;
  long in_FS_OFFSET;
  ChangeInFlight *unaff_retaddr;
  ChangeInFlight *in_stack_00000008;
  QAbstractItemModelTesterPrivate *in_stack_00000010;
  QModelIndex *in_stack_00000018;
  QAbstractItemModelTesterPrivate *in_stack_00000020;
  int i;
  int in_stack_00000080;
  int in_stack_00000090;
  QPersistentModelIndex p;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff4c;
  QList<QPersistentModelIndex> *in_stack_ffffffffffffff50;
  int local_6c;
  QPersistentModelIndex local_60 [3];
  undefined1 local_48 [24];
  undefined1 local_30 [24];
  QPersistentModelIndex in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  char *actual;
  
  actual = *(char **)(in_FS_OFFSET + 0x28);
  uVar6 = 0x393;
  bVar1 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr,actual,
                     (char *)CONCAT44(4,in_stack_fffffffffffffff0),
                     (char *)in_stack_ffffffffffffffe8.d,in_stack_00000080);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    *(undefined4 *)(in_RDI + 0xc4) = 0;
    for (local_6c = 0;
        qVar3 = QList<QPersistentModelIndex>::size((QList<QPersistentModelIndex> *)(in_RDI + 200)),
        local_6c < qVar3; local_6c = local_6c + 1) {
      pQVar4 = QList<QPersistentModelIndex>::operator[]
                         (in_stack_ffffffffffffff50,CONCAT44(in_stack_ffffffffffffff4c,uVar6));
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&stack0xffffffffffffffe8,(QPersistentModelIndex *)pQVar4);
      pQVar5 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x1918a3);
      uVar6 = QPersistentModelIndex::row();
      uVar2 = QPersistentModelIndex::column();
      QPersistentModelIndex::parent();
      (**(code **)(*(long *)pQVar5 + 0x60))(local_30,pQVar5,uVar6,uVar2,local_48);
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_60);
      uVar6 = 0x398;
      bVar1 = compare<QModelIndex,QModelIndex>
                        (in_stack_00000020,in_stack_00000018,(QModelIndex *)in_stack_00000010,
                         (char *)in_stack_00000008,(char *)unaff_retaddr,actual,in_stack_00000090);
      QPersistentModelIndex::~QPersistentModelIndex
                ((QPersistentModelIndex *)&stack0xffffffffffffffe8);
      if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_001919d5;
    }
    QList<QPersistentModelIndex>::clear(in_stack_ffffffffffffff50);
  }
LAB_001919d5:
  if (*(char **)(in_FS_OFFSET + 0x28) == actual) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::layoutChanged()
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::LayoutChanged);
    changeInFlight = ChangeInFlight::None;

    for (int i = 0; i < changing.size(); ++i) {
        QPersistentModelIndex p = changing[i];
        MODELTESTER_COMPARE(model->index(p.row(), p.column(), p.parent()), QModelIndex(p));
    }
    changing.clear();
}